

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  pointer *this_00;
  bool bVar1;
  Options *pOVar2;
  Options *options;
  size_type sVar3;
  reference this_01;
  pointer this_02;
  reference pvVar4;
  pointer pMVar5;
  reference this_03;
  pointer this_04;
  ulong uVar6;
  reference this_05;
  pointer this_06;
  Options *in_RCX;
  Options *extraout_RDX;
  allocator local_209;
  string local_208;
  int local_1e4;
  undefined1 local_1e0 [4];
  int i_5;
  undefined1 local_1c0 [8];
  NamespaceOpener proto_ns;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  undefined1 local_170 [8];
  NamespaceOpener ns_1;
  undefined1 local_148 [4];
  int i;
  undefined1 local_128 [8];
  NamespaceOpener ns;
  CrossFileReferences refs;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  GenerateSourceIncludes
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = &ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)this_00);
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)this_00);
  GenerateInternalForwardDeclarations
            (this,(CrossFileReferences *)
                  &ns.name_stack_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Namespace_abi_cxx11_
            ((string *)local_148,(cpp *)this->file_,(FileDescriptor *)&this->options_,in_RCX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_128,(string *)local_148,(Formatter *)local_50);
  std::__cxx11::string::~string((string *)local_148);
  for (ns_1.name_stack_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      pOVar2 = (Options *)
               (long)ns_1.name_stack_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      options = (Options *)
                std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                ::size(&this->message_generators_), pOVar2 < options;
      ns_1.name_stack_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ns_1.name_stack_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    GenerateSourceDefaultInstance
              (this,ns_1.name_stack_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_128);
  GenerateTables(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar1 = HasDescriptorMethods(this->file_,&this->options_);
  if (bVar1) {
    GenerateReflectionInitializationCode
              (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  Namespace_abi_cxx11_((string *)&i_2,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_170,(string *)&i_2,(Formatter *)local_50);
  std::__cxx11::string::~string((string *)&i_2);
  for (i_3 = 0; sVar3 = std::
                        vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                        ::size(&this->enum_generators_), (ulong)(long)i_3 < sVar3; i_3 = i_3 + 1) {
    this_01 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
              ::operator[](&this->enum_generators_,(long)i_3);
    this_02 = std::
              unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
              ::operator->(this_01);
    EnumGenerator::GenerateMethods
              (this_02,i_3,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
  }
  for (i_4 = 0; sVar3 = std::
                        vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                        ::size(&this->message_generators_), (ulong)(long)i_4 < sVar3; i_4 = i_4 + 1)
  {
    Formatter::operator()<>((Formatter *)local_50,"\n");
    Formatter::operator()<>
              ((Formatter *)local_50,
               "// ===================================================================\n");
    Formatter::operator()<>((Formatter *)local_50,"\n");
    pvVar4 = std::
             vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ::operator[](&this->message_generators_,(long)i_4);
    pMVar5 = std::
             unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator->(pvVar4);
    MessageGenerator::GenerateClassMethods
              (pMVar5,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (proto_ns.name_stack_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uVar6 = (ulong)proto_ns.name_stack_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar3 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::size(&this->service_generators_), uVar6 < sVar3;
        proto_ns.name_stack_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             proto_ns.name_stack_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      if (proto_ns.name_stack_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        Formatter::operator()<>((Formatter *)local_50,"\n");
      }
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "// ===================================================================\n");
      Formatter::operator()<>((Formatter *)local_50,"\n");
      this_03 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::operator[](&this->service_generators_,
                             (long)proto_ns.name_stack_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      this_04 = std::
                unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                ::operator->(this_03);
      ServiceGenerator::GenerateImplementation
                (this_04,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  for (proto_ns.name_stack_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      uVar6 = (ulong)(int)proto_ns.name_stack_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
      sVar3 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
              ::size(&this->extension_generators_), uVar6 < sVar3;
      proto_ns.name_stack_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)proto_ns.name_stack_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    this_05 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
              ::operator[](&this->extension_generators_,
                           (long)(int)proto_ns.name_stack_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_06 = std::
              unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator->(this_05);
    ExtensionGenerator::GenerateDefinition
              (this_06,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  Formatter::operator()<>((Formatter *)local_50,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_170);
  ProtobufNamespace_abi_cxx11_((string *)local_1e0,(cpp *)&this->options_,extraout_RDX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)local_1c0,(string *)local_1e0,(Formatter *)local_50);
  std::__cxx11::string::~string((string *)local_1e0);
  for (local_1e4 = 0; uVar6 = (ulong)local_1e4,
      sVar3 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::size(&this->message_generators_), uVar6 < sVar3; local_1e4 = local_1e4 + 1) {
    pvVar4 = std::
             vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ::operator[](&this->message_generators_,(long)local_1e4);
    pMVar5 = std::
             unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator->(pvVar4);
    MessageGenerator::GenerateSourceInProto2Namespace
              (pMVar5,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_1c0);
  Formatter::operator()<>((Formatter *)local_50,"\n// @@protoc_insertion_point(global_scope)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"net/proto2/public/port_undef.inc",&local_209);
  IncludeFile(this,&local_208,
              (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  CrossFileReferences::~CrossFileReferences
            ((CrossFileReferences *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  GenerateInternalForwardDeclarations(refs, printer);

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    for (int i = 0; i < message_generators_.size(); i++) {
      GenerateSourceDefaultInstance(i, printer);
    }
  }

  {
    GenerateTables(printer);

    if (HasDescriptorMethods(file_, options_)) {
      // Define the code to initialize reflection. This code uses a global
      // constructor to register reflection data with the runtime pre-main.
      GenerateReflectionInitializationCode(printer);
    }
  }

  {
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Actually implement the protos

    // Generate enums.
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateMethods(i, printer);
    }

    // Generate classes.
    for (int i = 0; i < message_generators_.size(); i++) {
      format("\n");
      format(kThickSeparator);
      format("\n");
      message_generators_[i]->GenerateClassMethods(printer);
    }

    if (HasGenericServices(file_, options_)) {
      // Generate services.
      for (int i = 0; i < service_generators_.size(); i++) {
        if (i == 0) format("\n");
        format(kThickSeparator);
        format("\n");
        service_generators_[i]->GenerateImplementation(printer);
      }
    }

    // Define extensions.
    for (int i = 0; i < extension_generators_.size(); i++) {
      extension_generators_[i]->GenerateDefinition(printer);
    }

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    for (int i = 0; i < message_generators_.size(); i++) {
      message_generators_[i]->GenerateSourceInProto2Namespace(printer);
    }
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");

  IncludeFile("net/proto2/public/port_undef.inc", printer);
}